

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::defaultListListeners
               (ostream *out,
               vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
               *descriptions)

{
  pointer pLVar1;
  ulong uVar2;
  pointer pLVar3;
  pointer pLVar4;
  pointer pLVar5;
  Column *this;
  Column *other;
  pointer pLVar6;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  Column local_d8;
  Columns local_a0;
  Column local_88;
  string local_50;
  
  std::operator<<(out,"Registered listeners:\n");
  this_00 = (descriptions->
            super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (descriptions->
           super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pLVar5 = this_00;
  pLVar3 = this_00;
  if (this_00 != pLVar1) {
    while( true ) {
      pLVar6 = pLVar5;
      pLVar5 = pLVar3 + 1;
      uVar2 = (pLVar6->name).m_size;
      if (pLVar5 == pLVar1) break;
      pLVar4 = pLVar3 + 1;
      pLVar3 = pLVar5;
      if ((pLVar4->name).m_size <= uVar2) {
        pLVar5 = pLVar6;
      }
    }
    for (; this_00 != pLVar1; this_00 = this_00 + 1) {
      StringRef::operator_cast_to_string(&local_50,&this_00->name);
      std::operator+(&local_f8,&local_50,':');
      TextFlow::Column::Column(&local_88,&local_f8);
      local_88.m_indent = 2;
      this = TextFlow::Column::width(&local_88,uVar2 + 5);
      TextFlow::Column::Column(&local_d8,&this_00->description);
      local_d8.m_initialIndent = 0;
      local_d8.m_indent = 2;
      other = TextFlow::Column::width(&local_d8,0x48 - uVar2);
      TextFlow::Column::operator+(&local_a0,this,other);
      TextFlow::operator<<(out,&local_a0);
      std::operator<<(out,'\n');
      std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                (&local_a0.m_columns);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::operator<<(out,'\n');
    std::ostream::flush();
  }
  return;
}

Assistant:

void defaultListListeners( std::ostream& out,
                               std::vector<ListenerDescription> const& descriptions ) {
        out << "Registered listeners:\n";

        if(descriptions.empty()) {
            return;
        }

        const auto maxNameLen =
            std::max_element( descriptions.begin(),
                              descriptions.end(),
                              []( ListenerDescription const& lhs,
                                  ListenerDescription const& rhs ) {
                                  return lhs.name.size() < rhs.name.size();
                              } )
                ->name.size();

        for ( auto const& desc : descriptions ) {
            out << TextFlow::Column( static_cast<std::string>( desc.name ) +
                                     ':' )
                           .indent( 2 )
                           .width( maxNameLen + 5 ) +
                       TextFlow::Column( desc.description )
                           .initialIndent( 0 )
                           .indent( 2 )
                           .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8 )
                << '\n';
        }

        out << '\n' << std::flush;
    }